

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeLiteGenerator::GetBuildCommand
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf,
          string *targetName)

{
  bool bVar1;
  string *psVar2;
  string *psVar3;
  ulong uVar4;
  ostream *poVar5;
  string local_230 [32];
  undefined1 local_210 [8];
  ostringstream ss;
  allocator<char> local_91;
  string local_90;
  string *local_70;
  string *make;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *generator;
  string *targetName_local;
  cmMakefile *mf_local;
  cmExtraCodeLiteGenerator *this_local;
  string *buildCommand;
  
  generator = targetName;
  targetName_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  this_local = (cmExtraCodeLiteGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_GENERATOR",&local_51);
  psVar2 = cmMakefile::GetSafeDefinition(mf,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  psVar3 = targetName_local;
  local_30 = psVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_MAKE_PROGRAM",&local_91);
  psVar3 = cmMakefile::GetRequiredDefinition((cmMakefile *)psVar3,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  local_70 = psVar3;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
  bVar1 = std::operator==(local_30,"NMake Makefiles");
  if ((bVar1) || (bVar1 = std::operator==(local_30,"Ninja"), bVar1)) {
    std::operator<<((ostream *)local_210,(string *)local_70);
  }
  else {
    bVar1 = std::operator==(local_30,"MinGW Makefiles");
    if ((bVar1) || (bVar1 = std::operator==(local_30,"Unix Makefiles"), bVar1)) {
      poVar5 = std::operator<<((ostream *)local_210,(string *)local_70);
      poVar5 = std::operator<<(poVar5," -f$(ProjectPath)/Makefile -j ");
      std::ostream::operator<<(poVar5,this->CpuCount);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)local_210," ");
    std::operator<<(poVar5,(string *)generator);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_230);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetBuildCommand(
  const cmMakefile* mf, const std::string& targetName) const
{
  const std::string& generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  const std::string& make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string buildCommand = make; // Default
  std::ostringstream ss;
  if (generator == "NMake Makefiles" || generator == "Ninja") {
    ss << make;
  } else if (generator == "MinGW Makefiles" || generator == "Unix Makefiles") {
    ss << make << " -f$(ProjectPath)/Makefile -j " << this->CpuCount;
  }
  if (!targetName.empty()) {
    ss << " " << targetName;
  }
  buildCommand = ss.str();
  return buildCommand;
}